

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall
despot::util::tinyxml::TiXmlElement::SetDoubleAttribute(TiXmlElement *this,char *name,double val)

{
  char buf [256];
  char acStack_118 [256];
  
  snprintf(acStack_118,0x100,"%f");
  SetAttribute(this,name,acStack_118);
  return;
}

Assistant:

void TiXmlElement::SetDoubleAttribute(const char * name, double val) {
	char buf[256];
#if defined(TIXML_SNPRINTF)
	TIXML_SNPRINTF(buf, sizeof(buf), "%f", val);
#else
	sprintf( buf, "%f", val );
#endif
	SetAttribute(name, buf);
}